

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestRunStats::TestRunStats(TestRunStats *this,TestRunStats *param_1)

{
  this->_vptr_TestRunStats = (_func_int **)&PTR__TestRunStats_00571ea0;
  std::__cxx11::string::string((string *)&this->runInfo,(string *)&param_1->runInfo);
  Totals::Totals(&this->totals,&param_1->totals);
  this->aborting = param_1->aborting;
  return;
}

Assistant:

TestRunStats( TestRunStats const& )              = default;